

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int VP8LDecodeAlphaImageStream(ALPHDecoder *alph_dec,int last_row)

{
  VP8LBitReader *br;
  int *piVar1;
  ushort uVar2;
  int width;
  int iVar3;
  VP8LDecoder *dec;
  uint32_t *data;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  HuffmanCode *pHVar18;
  uint *__src;
  undefined1 *__dest;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  HTreeGroup *local_58;
  
  dec = alph_dec->vp8l_dec_;
  iVar14 = 1;
  if (dec->last_row_ < last_row) {
    if (alph_dec->use_8b_decode_ == 0) {
      WebPInitAlphaProcessing();
    }
    data = dec->pixels_;
    width = dec->width_;
    if (alph_dec->use_8b_decode_ == 0) {
      iVar14 = DecodeImageData(dec,data,width,dec->height_,last_row,ExtractAlphaRows);
      return iVar14;
    }
    iVar19 = dec->last_pixel_;
    uVar12 = (long)iVar19 / (long)width;
    uVar6 = (long)iVar19 % (long)width;
    uVar23 = uVar12 & 0xffffffff;
    uVar20 = uVar6 & 0xffffffff;
    iVar8 = width * last_row;
    if (iVar19 < iVar8) {
      iVar14 = (dec->hdr_).huffman_subsample_bits_;
      if (iVar14 == 0) {
        lVar11 = 0;
      }
      else {
        bVar13 = (byte)iVar14;
        lVar11 = (long)(int)(dec->hdr_).huffman_image_
                            [((int)uVar6 >> (bVar13 & 0x1f)) +
                             ((int)uVar12 >> (bVar13 & 0x1f)) * (dec->hdr_).huffman_xsize_];
      }
      local_58 = (dec->hdr_).htree_groups_ + lVar11;
    }
    else {
      local_58 = (HTreeGroup *)0x0;
    }
    uVar17 = (dec->hdr_).huffman_mask_;
    br = &dec->br_;
    iVar9 = dec->height_ * width;
    bVar7 = true;
    do {
      uVar16 = (uint)uVar23;
      if (((dec->br_).eos_ != 0) || (iVar8 <= iVar19)) {
        if ((int)uVar16 < last_row) {
          last_row = uVar16;
        }
        ExtractPalettedAlphaRows(dec,last_row);
        goto LAB_0010aeca;
      }
      uVar22 = (uint)uVar20;
      if ((uVar17 & uVar22) == 0) {
        iVar14 = (dec->hdr_).huffman_subsample_bits_;
        if (iVar14 == 0) {
          lVar11 = 0;
        }
        else {
          bVar13 = (byte)iVar14;
          lVar11 = (long)(int)(dec->hdr_).huffman_image_
                              [((int)uVar22 >> (bVar13 & 0x1f)) +
                               ((int)uVar16 >> (bVar13 & 0x1f)) * (dec->hdr_).huffman_xsize_];
        }
        local_58 = (dec->hdr_).htree_groups_ + lVar11;
      }
      if (0x1f < (dec->br_).bit_pos_) {
        VP8LDoFillBitWindow(br);
      }
      uVar12 = (dec->br_).val_;
      iVar14 = (dec->br_).bit_pos_;
      pHVar18 = local_58->htrees[0] + (uVar12 >> ((byte)iVar14 & 0x3f) & 0xff);
      bVar13 = pHVar18->bits;
      if (8 < bVar13) {
        iVar14 = iVar14 + 8;
        (dec->br_).bit_pos_ = iVar14;
        pHVar18 = pHVar18 + (ulong)pHVar18->value +
                            (ulong)(~(-1 << (bVar13 - 8 & 0x1f)) &
                                   (uint)(uVar12 >> ((byte)iVar14 & 0x3f)));
      }
      piVar1 = &(dec->br_).bit_pos_;
      *piVar1 = *piVar1 + (uint)pHVar18->bits;
      uVar2 = pHVar18->value;
      if (uVar2 < 0x100) {
        *(char *)((long)data + (long)iVar19) = (char)uVar2;
        iVar19 = iVar19 + 1;
        uVar20 = (ulong)(uVar22 + 1);
        if (width <= (int)(uVar22 + 1)) {
          uVar22 = uVar16 + 1;
          bVar4 = (int)uVar16 < last_row;
          uVar20 = 0;
          uVar16 = uVar22;
          if ((uVar22 & 0xf) == 0 && bVar4) {
            ExtractPalettedAlphaRows(dec,uVar22);
          }
        }
LAB_0010ae7f:
        uVar22 = 1;
        if (((dec->br_).eos_ == 0) && (uVar22 = 0, (dec->br_).pos_ == (dec->br_).len_)) {
          uVar22 = (uint)(0x40 < (dec->br_).bit_pos_);
        }
        (dec->br_).eos_ = uVar22;
        iVar14 = 0;
      }
      else if (uVar2 < 0x118) {
        uVar21 = (uint)uVar2;
        if (uVar21 < 0x104) {
          uVar21 = uVar21 - 0x100;
        }
        else {
          uVar15 = uVar2 - 0x102 >> 1;
          uVar10 = VP8LReadBits(br,uVar15);
          uVar21 = uVar10 + ((uVar21 & 1 | 2) << ((byte)uVar15 & 0x1f));
        }
        uVar12 = (dec->br_).val_;
        iVar14 = (dec->br_).bit_pos_;
        pHVar18 = local_58->htrees[4] + (uVar12 >> ((byte)iVar14 & 0x3f) & 0xff);
        bVar13 = pHVar18->bits;
        if (8 < bVar13) {
          iVar14 = iVar14 + 8;
          (dec->br_).bit_pos_ = iVar14;
          pHVar18 = pHVar18 + (ulong)pHVar18->value +
                              (ulong)(~(-1 << (bVar13 - 8 & 0x1f)) &
                                     (uint)(uVar12 >> ((byte)iVar14 & 0x3f)));
        }
        iVar14 = (uint)pHVar18->bits + (dec->br_).bit_pos_;
        (dec->br_).bit_pos_ = iVar14;
        uVar2 = pHVar18->value;
        uVar15 = (uint)uVar2;
        if (0x1f < iVar14) {
          VP8LDoFillBitWindow(br);
        }
        if (3 < uVar2) {
          uVar15 = uVar2 - 2 >> 1;
          uVar10 = VP8LReadBits(br,uVar15);
          uVar15 = uVar10 + ((uVar2 & 1 | 2) << ((byte)uVar15 & 0x1f));
        }
        if ((int)(uVar15 + 1) < 0x79) {
          iVar14 = ((uint)("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                           [(int)uVar15] >> 4) * width -
                   ("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                    [(int)uVar15] & 0xf)) + 8;
          if (iVar14 < 2) {
            iVar14 = 1;
          }
        }
        else {
          iVar14 = uVar15 - 0x77;
        }
        uVar15 = uVar21 + 1;
        bVar4 = iVar14 <= iVar19;
        bVar5 = (int)uVar15 <= iVar9 - iVar19;
        if (bVar5 && bVar4) {
          __dest = (undefined1 *)((long)data + (long)iVar19);
          __src = (uint *)(__dest + -(long)iVar14);
          lVar11 = -(long)iVar14;
          if ((int)uVar15 < 8) {
LAB_0010ad08:
            if (iVar14 < (int)uVar15) {
              if (uVar21 < 0x7fffffff) {
                uVar12 = (ulong)uVar15;
                do {
                  *__dest = __dest[lVar11];
                  __dest = __dest + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
            }
            else {
              memcpy(__dest,__src,(long)(int)uVar15);
            }
          }
          else {
            if (iVar14 == 4) {
              uVar16 = *__src;
            }
            else if (iVar14 == 2) {
              uVar16 = CONCAT22((short)*__src,(short)*__src);
            }
            else {
              if (iVar14 != 1) goto LAB_0010ad08;
              uVar16 = (uint)(byte)*__src * 0x1010101;
            }
            uVar21 = uVar15;
            if (((ulong)__dest & 3) != 0) {
              uVar12 = (long)data + (long)iVar19 + 1;
              do {
                *__dest = __dest[lVar11];
                __dest = __dest + 1;
                uVar16 = uVar16 << 0x18 | uVar16 >> 8;
                uVar21 = uVar21 - 1;
                uVar6 = uVar12 & 3;
                uVar12 = uVar12 + 1;
              } while (uVar6 != 0);
              __src = (uint *)(__dest + lVar11);
            }
            if ((int)uVar21 >> 2 < 1) {
              uVar12 = 0;
            }
            else {
              uVar12 = 0;
              do {
                *(uint *)(__dest + uVar12 * 4) = uVar16;
                uVar12 = uVar12 + 1;
              } while ((uint)((int)uVar21 >> 2) != uVar12);
            }
            if ((int)uVar12 * 4 < (int)uVar21) {
              uVar12 = (uVar12 & 0xffffffff) << 2;
              do {
                __dest[uVar12] = *(byte *)((long)__src + uVar12);
                uVar12 = uVar12 + 1;
              } while (uVar21 != uVar12);
            }
          }
          uVar22 = uVar22 + uVar15;
          while( true ) {
            uVar20 = (ulong)uVar22;
            uVar16 = (uint)uVar23;
            if ((int)uVar22 < width) break;
            uVar21 = uVar16 + 1;
            uVar23 = (ulong)uVar21;
            if ((uVar21 & 0xf) == 0 && (int)uVar16 < last_row) {
              ExtractPalettedAlphaRows(dec,uVar21);
            }
            uVar22 = uVar22 - width;
          }
          iVar19 = uVar15 + iVar19;
          iVar14 = 0;
          if ((iVar19 < iVar8) && ((uVar22 & uVar17) != 0)) {
            iVar3 = (dec->hdr_).huffman_subsample_bits_;
            if (iVar3 == 0) {
              lVar11 = 0;
            }
            else {
              bVar13 = (byte)iVar3;
              lVar11 = (long)(int)(dec->hdr_).huffman_image_
                                  [((int)uVar22 >> (bVar13 & 0x1f)) +
                                   ((int)uVar16 >> (bVar13 & 0x1f)) * (dec->hdr_).huffman_xsize_];
            }
            local_58 = (dec->hdr_).htree_groups_ + lVar11;
          }
        }
        else {
          iVar14 = 4;
          bVar7 = false;
        }
        if (bVar5 && bVar4) goto LAB_0010ae7f;
      }
      else {
        iVar14 = 4;
        bVar7 = false;
      }
      uVar23 = (ulong)uVar16;
    } while (iVar14 == 0);
    if (iVar14 == 4) {
LAB_0010aeca:
      uVar17 = 1;
      if (((dec->br_).eos_ == 0) && (uVar17 = 0, (dec->br_).pos_ == (dec->br_).len_)) {
        uVar17 = (uint)(0x40 < (dec->br_).bit_pos_);
      }
      (dec->br_).eos_ = uVar17;
      if ((bVar7) && ((uVar17 == 0 || (iVar9 <= iVar19)))) {
        dec->last_pixel_ = iVar19;
        iVar14 = 1;
      }
      else {
        iVar14 = 0;
        if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
          dec->status_ = uVar17 * 2 + VP8_STATUS_BITSTREAM_ERROR;
        }
      }
    }
  }
  return iVar14;
}

Assistant:

int VP8LDecodeAlphaImageStream(ALPHDecoder* const alph_dec, int last_row) {
  VP8LDecoder* const dec = alph_dec->vp8l_dec_;
  assert(dec != NULL);
  assert(last_row <= dec->height_);

  if (dec->last_row_ >= last_row) {
    return 1;  // done
  }

  if (!alph_dec->use_8b_decode_) WebPInitAlphaProcessing();

  // Decode (with special row processing).
  return alph_dec->use_8b_decode_ ?
      DecodeAlphaData(dec, (uint8_t*)dec->pixels_, dec->width_, dec->height_,
                      last_row) :
      DecodeImageData(dec, dec->pixels_, dec->width_, dec->height_,
                      last_row, ExtractAlphaRows);
}